

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  stbi_uc sVar7;
  int iVar8;
  stbi__uint32 sVar9;
  stbi__uint32 sVar10;
  uint uVar11;
  int depth;
  int iVar12;
  int iVar13;
  char *pcVar14;
  stbi_uc *psVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  stbi_uc *psVar20;
  uint x;
  uint uVar21;
  ulong uVar22;
  int out_n;
  ushort uVar23;
  uint uVar24;
  uint y;
  long lVar25;
  uint color;
  size_t sVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  stbi_uc *psVar30;
  long *in_FS_OFFSET;
  bool bVar31;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_47c;
  stbi__uint32 raw_len;
  ulong local_458;
  stbi_uc *local_450;
  long local_448;
  long local_440;
  stbi_uc palette [1024];
  size_t __size;
  
  tc[0] = '\0';
  tc[1] = '\0';
  tc[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar8 = stbi__check_png_header(s);
  if (iVar8 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar31 = true;
  bVar5 = 0;
  color = 0;
  bVar3 = false;
  uVar24 = 0;
  uVar11 = 0;
  uVar28 = 0;
  bVar4 = false;
  bVar27 = 0;
LAB_001260de:
  sVar9 = stbi__get32be(s);
  sVar26 = (size_t)sVar9;
  sVar10 = stbi__get32be(s);
  if (sVar10 != 0x43674249) {
    if (sVar10 == 0x49444154) {
      if (!bVar31) {
        if ((bVar27 == 0) || (uVar24 != 0)) {
          if (scan == 2) {
            if (bVar27 != 0) {
              s->img_n = (uint)bVar27;
              return 1;
            }
            return 1;
          }
          if (sVar9 < 0x40000001) {
            uVar29 = uVar28 + sVar9;
            if ((int)uVar29 < (int)uVar28) {
              return 0;
            }
            if (uVar11 < uVar29) {
              if (sVar9 < 0x1001) {
                sVar26 = 0x1000;
              }
              if (uVar11 != 0) {
                sVar26 = (ulong)uVar11;
              }
              do {
                __size = sVar26;
                uVar11 = (uint)__size;
                sVar26 = (ulong)(uVar11 * 2);
              } while (uVar11 < uVar29);
              psVar15 = (stbi_uc *)realloc(*ppsVar1,__size);
              if (psVar15 == (stbi_uc *)0x0) goto LAB_00126c7d;
              *ppsVar1 = psVar15;
            }
            else {
              psVar15 = *ppsVar1;
            }
            iVar8 = stbi__getn(s,psVar15 + uVar28,sVar9);
            if (iVar8 != 0) {
              bVar31 = false;
              uVar28 = uVar29;
              goto LAB_00126502;
            }
            pcVar14 = "outofdata";
          }
          else {
            pcVar14 = "IDAT size limit";
          }
        }
        else {
          pcVar14 = "no PLTE";
        }
        goto LAB_00126543;
      }
    }
    else {
      if (sVar10 == 0x49484452) {
        if (!bVar31) {
          pcVar14 = "multiple IHDR";
          goto LAB_00126543;
        }
        if (sVar9 != 0xd) {
          pcVar14 = "bad IHDR len";
          goto LAB_00126543;
        }
        sVar9 = stbi__get32be(s);
        s->img_x = sVar9;
        sVar9 = stbi__get32be(s);
        s->img_y = sVar9;
        if ((sVar9 < 0x1000001) && (s->img_x < 0x1000001)) {
          bVar5 = stbi__get8(s);
          z->depth = (uint)bVar5;
          if ((0x10 < bVar5) || ((0x10116U >> (bVar5 & 0x1f) & 1) == 0)) {
            pcVar14 = "1/2/4/8/16-bit only";
            goto LAB_00126543;
          }
          bVar6 = stbi__get8(s);
          if (bVar6 < 7) {
            color = (uint)bVar6;
            if (bVar6 == 3) {
              bVar27 = 3;
              if (z->depth != 0x10) {
LAB_001263d0:
                sVar7 = stbi__get8(s);
                if (sVar7 != '\0') {
                  pcVar14 = "bad comp method";
                  goto LAB_00126543;
                }
                sVar7 = stbi__get8(s);
                if (sVar7 != '\0') {
                  pcVar14 = "bad filter method";
                  goto LAB_00126543;
                }
                bVar5 = stbi__get8(s);
                if (1 < bVar5) {
                  pcVar14 = "bad interlace method";
                  goto LAB_00126543;
                }
                uVar29 = s->img_x;
                if ((uVar29 == 0) || (s->img_y == 0)) {
                  pcVar14 = "0-pixel image";
                  goto LAB_00126543;
                }
                if (bVar27 == 0) {
                  uVar16 = (uint)(3 < bVar6) + (bVar6 & 2) + 1;
                  s->img_n = uVar16;
                  uVar29 = (uint)((0x40000000 / (ulong)uVar29) / (ulong)uVar16);
                  bVar27 = 0;
                }
                else {
                  s->img_n = 1;
                  uVar29 = (uint)(0x40000000 / (ulong)uVar29 >> 2);
                }
                bVar31 = false;
                if (s->img_y <= uVar29) goto LAB_00126502;
                goto LAB_0012650f;
              }
            }
            else if ((bVar6 & 1) == 0) goto LAB_001263d0;
          }
          pcVar14 = "bad ctype";
          goto LAB_00126543;
        }
LAB_0012650f:
        pcVar14 = "too large";
LAB_00126543:
        in_FS_OFFSET[-4] = (long)pcVar14;
        return 0;
      }
      if (sVar10 == 0x504c5445) {
        if (!bVar31) {
          if ((sVar9 < 0x301) && (uVar24 = (sVar9 & 0xffff) / 3, uVar24 * 3 == sVar9)) {
            for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4 + 1] = sVar7;
              sVar7 = stbi__get8(s);
              palette[uVar19 * 4 + 2] = sVar7;
              palette[uVar19 * 4 + 3] = 0xff;
            }
            bVar31 = false;
            goto LAB_00126502;
          }
          pcVar14 = "invalid PLTE";
          goto LAB_00126543;
        }
      }
      else if (sVar10 == 0x74524e53) {
        if (!bVar31) {
          if (*ppsVar1 != (stbi_uc *)0x0) {
            pcVar14 = "tRNS after IDAT";
            goto LAB_00126543;
          }
          if (bVar27 == 0) {
            uVar29 = s->img_n;
            if ((uVar29 & 1) != 0) {
              if (uVar29 * 2 != sVar9) goto LAB_001265bd;
              if (scan == 2) {
                s->img_n = uVar29 + 1;
                return 1;
              }
              if (z->depth == 0x10) {
                for (lVar17 = 0; lVar17 < (int)uVar29; lVar17 = lVar17 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc16[lVar17] = (stbi__uint16)iVar8;
                  uVar29 = s->img_n;
                }
              }
              else {
                for (lVar17 = 0; lVar17 < (int)uVar29; lVar17 = lVar17 + 1) {
                  iVar8 = stbi__get16be(s);
                  tc[lVar17] = ""[z->depth] * (char)iVar8;
                  uVar29 = s->img_n;
                }
              }
              bVar4 = true;
              bVar31 = false;
              bVar27 = 0;
              goto LAB_00126502;
            }
            pcVar14 = "tRNS with alpha";
            goto LAB_00126543;
          }
          if (scan == 2) {
            s->img_n = 4;
            return 1;
          }
          if (uVar24 == 0) {
            pcVar14 = "tRNS before PLTE";
            goto LAB_00126543;
          }
          if (uVar24 < sVar9) {
LAB_001265bd:
            pcVar14 = "bad tRNS len";
            goto LAB_00126543;
          }
          for (uVar19 = 0; sVar26 != uVar19; uVar19 = uVar19 + 1) {
            sVar7 = stbi__get8(s);
            palette[uVar19 * 4 + 3] = sVar7;
          }
          bVar27 = 4;
          bVar31 = false;
          goto LAB_00126502;
        }
      }
      else if (sVar10 == 0x49454e44) {
        if (!bVar31) {
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 == (stbi_uc *)0x0) {
            pcVar14 = "no IDAT";
            goto LAB_00126543;
          }
          raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar15 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,uVar28,raw_len,(int *)&raw_len,(uint)!bVar3);
          z->expanded = psVar15;
          if (psVar15 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          z->idata = (stbi_uc *)0x0;
          iVar8 = s->img_n + 1;
          iVar13 = s->img_n;
          if (bVar4) {
            iVar13 = iVar8;
          }
          out_n = iVar13;
          if (req_comp != 3) {
            out_n = iVar8;
          }
          if (bVar27 != 0) {
            out_n = iVar13;
          }
          if (iVar8 != req_comp) {
            out_n = iVar13;
          }
          s->img_out_n = out_n;
          uVar24 = z->depth;
          local_458 = (ulong)uVar24;
          iVar8 = out_n << (uVar24 == 0x10);
          sVar9 = z->s->img_x;
          sVar10 = z->s->img_y;
          if (bVar5 == 0) {
            iVar8 = stbi__create_png_image_raw
                              (z,z->expanded,raw_len,out_n,sVar9,sVar10,uVar24,color);
            if (iVar8 == 0) {
              return 0;
            }
          }
          else {
            local_47c = raw_len;
            local_450 = z->expanded;
            psVar15 = (stbi_uc *)stbi__malloc_mad3(sVar9,sVar10,iVar8,0);
            if (psVar15 == (stbi_uc *)0x0) goto LAB_00126c7d;
            sVar26 = (size_t)iVar8;
            for (lVar17 = 0; lVar17 != 7; lVar17 = lVar17 + 1) {
              psVar2 = z->s;
              uVar24 = (&DAT_00148550)[lVar17];
              uVar28 = (&DAT_00148590)[lVar17];
              uVar21 = ~uVar24 + psVar2->img_x + uVar28;
              x = uVar21 / uVar28;
              uVar11 = (&DAT_00148570)[lVar17];
              uVar29 = (&DAT_001485b0)[lVar17];
              uVar16 = ~uVar11 + psVar2->img_y + uVar29;
              y = uVar16 / uVar29;
              if ((uVar28 <= uVar21) && (uVar29 <= uVar16)) {
                depth = (int)local_458;
                iVar13 = psVar2->img_n;
                local_448 = lVar17;
                iVar12 = stbi__create_png_image_raw(z,local_450,local_47c,out_n,x,y,depth,color);
                if (iVar12 == 0) {
                  free(psVar15);
                  return 0;
                }
                uVar16 = (((int)(x * depth * iVar13 + 7) >> 3) + 1) * y;
                local_440 = (long)(int)y;
                iVar13 = uVar11 * iVar8;
                for (lVar17 = 0; lVar17 < local_440; lVar17 = lVar17 + 1) {
                  psVar30 = psVar15 + (long)(int)uVar24 * sVar26;
                  for (lVar25 = 0; lVar25 < (int)x; lVar25 = lVar25 + 1) {
                    memcpy(psVar30 + z->s->img_x * iVar13,
                           z->out + (lVar25 + lVar17 * (int)x) * sVar26,sVar26);
                    psVar30 = psVar30 + (long)(int)uVar28 * sVar26;
                  }
                  iVar13 = iVar13 + uVar29 * iVar8;
                }
                free(z->out);
                local_450 = local_450 + uVar16;
                local_47c = local_47c - uVar16;
                lVar17 = local_448;
              }
            }
            z->out = psVar15;
          }
          if (bVar4) {
            psVar15 = z->out;
            iVar13 = z->s->img_y * z->s->img_x;
            iVar8 = s->img_out_n;
            if (z->depth == 0x10) {
              if (iVar8 == 4) {
                for (lVar17 = 0; iVar13 != (int)lVar17; lVar17 = lVar17 + 1) {
                  if (((*(stbi__uint16 *)(psVar15 + lVar17 * 8) == tc16[0]) &&
                      (*(stbi__uint16 *)(psVar15 + lVar17 * 8 + 2) == tc16[1])) &&
                     (*(stbi__uint16 *)(psVar15 + lVar17 * 8 + 4) == tc16[2])) {
                    (psVar15 + lVar17 * 8 + 6)[0] = '\0';
                    (psVar15 + lVar17 * 8 + 6)[1] = '\0';
                  }
                }
              }
              else {
                if (iVar8 != 2) {
                  __assert_fail("out_n == 2 || out_n == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/stb_image.h"
                                ,0x1360,
                                "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                               );
                }
                for (lVar17 = 0; iVar13 != (int)lVar17; lVar17 = lVar17 + 1) {
                  *(ushort *)(psVar15 + lVar17 * 4 + 2) =
                       -(ushort)(*(stbi__uint16 *)(psVar15 + lVar17 * 4) != tc16[0]);
                }
              }
            }
            else if (iVar8 == 4) {
              for (lVar17 = 0; iVar13 != (int)lVar17; lVar17 = lVar17 + 1) {
                if (((psVar15[lVar17 * 4] == tc[0]) && (psVar15[lVar17 * 4 + 1] == tc[1])) &&
                   (psVar15[lVar17 * 4 + 2] == tc[2])) {
                  psVar15[lVar17 * 4 + 3] = '\0';
                }
              }
            }
            else {
              if (iVar8 != 2) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/stb_image.h"
                              ,0x1347,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                ;
              }
              for (lVar17 = 0; iVar13 != (int)lVar17; lVar17 = lVar17 + 1) {
                psVar15[lVar17 * 2 + 1] = -(psVar15[lVar17 * 2] != tc[0]);
              }
            }
          }
          if (bVar3) {
            piVar18 = &stbi__de_iphone_flag_global;
            if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
              piVar18 = (int *)(*in_FS_OFFSET + -8);
            }
            if ((*piVar18 != 0) && (2 < s->img_out_n)) {
              psVar2 = z->s;
              psVar15 = z->out;
              iVar8 = psVar2->img_y * psVar2->img_x;
              if (psVar2->img_out_n == 4) {
                piVar18 = &stbi__unpremultiply_on_load_global;
                if (*(int *)((long)in_FS_OFFSET + -0xc) != 0) {
                  piVar18 = (int *)(*in_FS_OFFSET + -0x10);
                }
                if (*piVar18 == 0) {
                  for (lVar17 = 0; iVar8 != (int)lVar17; lVar17 = lVar17 + 1) {
                    sVar7 = psVar15[lVar17 * 4];
                    psVar15[lVar17 * 4] = psVar15[lVar17 * 4 + 2];
                    psVar15[lVar17 * 4 + 2] = sVar7;
                  }
                }
                else {
                  for (lVar17 = 0; iVar8 != (int)lVar17; lVar17 = lVar17 + 1) {
                    bVar5 = psVar15[lVar17 * 4 + 3];
                    bVar6 = psVar15[lVar17 * 4];
                    if (bVar5 == 0) {
                      psVar15[lVar17 * 4] = psVar15[lVar17 * 4 + 2];
                      psVar15[lVar17 * 4 + 2] = bVar6;
                    }
                    else {
                      uVar24 = (uint)(bVar5 >> 1);
                      uVar23 = (ushort)bVar5;
                      psVar15[lVar17 * 4] =
                           (stbi_uc)(((uint)psVar15[lVar17 * 4 + 2] * 0xff + uVar24 & 0xffff) /
                                    (uint)uVar23);
                      psVar15[lVar17 * 4 + 1] =
                           (stbi_uc)(((uint)psVar15[lVar17 * 4 + 1] * 0xff + uVar24 & 0xffff) /
                                    (uint)uVar23);
                      psVar15[lVar17 * 4 + 2] =
                           (stbi_uc)(((uint)bVar6 * 0xff + uVar24 & 0xffff) / (uint)uVar23);
                    }
                  }
                }
              }
              else {
                if (psVar2->img_out_n != 3) {
                  __assert_fail("s->img_out_n == 4",
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/stb_image.h"
                                ,0x13cc,"void stbi__de_iphone(stbi__png *)");
                }
                while (bVar31 = iVar8 != 0, iVar8 = iVar8 + -1, bVar31) {
                  sVar7 = *psVar15;
                  *psVar15 = psVar15[2];
                  psVar15[2] = sVar7;
                  psVar15 = psVar15 + 3;
                }
              }
            }
          }
          if (bVar27 == 0) {
            if (bVar4) {
              s->img_n = s->img_n + 1;
            }
          }
          else {
            s->img_n = (uint)bVar27;
            uVar24 = (uint)bVar27;
            if (2 < req_comp) {
              uVar24 = req_comp;
            }
            s->img_out_n = uVar24;
            psVar15 = z->out;
            uVar28 = z->s->img_y * z->s->img_x;
            psVar30 = (stbi_uc *)stbi__malloc_mad2(uVar28,uVar24,0);
            if (psVar30 == (stbi_uc *)0x0) {
LAB_00126c7d:
              in_FS_OFFSET[-4] = (long)"outofmem";
              return 0;
            }
            uVar19 = 0;
            psVar20 = psVar30;
            if (uVar24 == 3) {
              for (; uVar28 != uVar19; uVar19 = uVar19 + 1) {
                uVar22 = (ulong)psVar15[uVar19];
                *psVar20 = palette[uVar22 * 4];
                psVar20[1] = palette[uVar22 * 4 + 1];
                psVar20[2] = palette[uVar22 * 4 + 2];
                psVar20 = psVar20 + 3;
              }
            }
            else {
              for (; uVar28 != uVar19; uVar19 = uVar19 + 1) {
                *(undefined4 *)(psVar30 + uVar19 * 4) =
                     *(undefined4 *)(palette + (ulong)psVar15[uVar19] * 4);
              }
            }
            free(psVar15);
            z->out = psVar30;
          }
          free(z->expanded);
          z->expanded = (stbi_uc *)0x0;
          stbi__get32be(s);
          return 1;
        }
      }
      else if (!bVar31) {
        bVar31 = false;
        if ((sVar10 >> 0x1d & 1) == 0) {
          stbi__parse_png_file::invalid_chunk._0_4_ =
               sVar10 >> 0x18 | (sVar10 & 0xff0000) >> 8 | (sVar10 & 0xff00) << 8 | sVar10 << 0x18;
          in_FS_OFFSET[-4] = (long)stbi__parse_png_file::invalid_chunk;
          return 0;
        }
        goto LAB_00126253;
      }
    }
    pcVar14 = "first not IHDR";
    goto LAB_00126543;
  }
  bVar3 = true;
LAB_00126253:
  stbi__skip(s,sVar9);
LAB_00126502:
  stbi__get32be(s);
  goto LAB_001260de;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}